

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::TimeZoneFormat(TimeZoneFormat *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  size_t sVar4;
  TimeZoneNames *pTVar5;
  NumberingSystem *this_00;
  UnicodeString *local_230;
  undefined1 local_210 [8];
  UnicodeString digits;
  UBool useDefDigits;
  NumberingSystem *ns;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  ConstChar16Ptr local_1a0;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  UErrorCode local_17c;
  UChar *pUStack_178;
  UErrorCode tmpStatus;
  UChar *sep;
  UBool useDefaultOffsetPatterns;
  UnicodeString local_160;
  ConstChar16Ptr local_120;
  int local_114;
  UResourceBundle *pUStack_110;
  int32_t len;
  UChar *resStr;
  UResourceBundle *zoneStringsArray;
  UResourceBundle *zoneBundle;
  UChar *hourFormats;
  UChar *gmtPattern;
  char loc [157];
  int32_t regionLen;
  char *region;
  int32_t i;
  UErrorCode *status_local;
  Locale *locale_local;
  TimeZoneFormat *this_local;
  
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_004a9bf8;
  Locale::Locale(&this->fLocale,locale);
  this->fTimeZoneNames = (TimeZoneNames *)0x0;
  this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
  UnicodeString::UnicodeString(&this->fGMTPattern);
  local_230 = (UnicodeString *)&this->field_0x280;
  do {
    UnicodeString::UnicodeString(local_230);
    local_230 = local_230 + 1;
  } while (local_230 != (UnicodeString *)this->fGMTOffsetDigits);
  UnicodeString::UnicodeString(&this->fGMTZeroFormat);
  this->fDefParseOptionFlags = 0;
  UnicodeString::UnicodeString(&this->fGMTPatternPrefix);
  UnicodeString::UnicodeString(&this->fGMTPatternSuffix);
  this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
  for (region._0_4_ = 0; (int)region < 6; region._0_4_ = (int)region + 1) {
    this->fGMTOffsetPatternItems[(int)region] = (UVector *)0x0;
  }
  pcVar3 = Locale::getCountry(&this->fLocale);
  sVar4 = strlen(pcVar3);
  if ((int)sVar4 == 0) {
    pcVar3 = Locale::getName(&this->fLocale);
    uloc_addLikelySubtags_63(pcVar3,(char *)&gmtPattern,0x9d,status);
    iVar2 = uloc_getCountry_63((char *)&gmtPattern,this->fTargetRegion,4,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 == '\0') {
      return;
    }
    this->fTargetRegion[iVar2] = '\0';
  }
  else if ((int)sVar4 < 4) {
    strcpy(this->fTargetRegion,pcVar3);
  }
  else {
    this->fTargetRegion[0] = '\0';
  }
  pTVar5 = TimeZoneNames::createInstance(locale,status);
  this->fTimeZoneNames = pTVar5;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    hourFormats = (UChar *)0x0;
    zoneBundle = (UResourceBundle *)0x0;
    pcVar3 = Locale::getName(locale);
    zoneStringsArray = ures_open_63("icudt63l-zone",pcVar3,status);
    resStr = (UChar *)ures_getByKeyWithFallback_63
                                (zoneStringsArray,"zoneStrings",(UResourceBundle *)0x0,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      pUStack_110 = (UResourceBundle *)
                    ures_getStringByKeyWithFallback_63
                              ((UResourceBundle *)resStr,"gmtFormat",&local_114,status);
      if (0 < local_114) {
        hourFormats = (UChar *)pUStack_110;
      }
      pUStack_110 = (UResourceBundle *)
                    ures_getStringByKeyWithFallback_63
                              ((UResourceBundle *)resStr,"gmtZeroFormat",&local_114,status);
      if (0 < local_114) {
        ConstChar16Ptr::ConstChar16Ptr(&local_120,(char16_t *)pUStack_110);
        UnicodeString::setTo(&this->fGMTZeroFormat,'\x01',&local_120,local_114);
        ConstChar16Ptr::~ConstChar16Ptr(&local_120);
      }
      pUStack_110 = (UResourceBundle *)
                    ures_getStringByKeyWithFallback_63
                              ((UResourceBundle *)resStr,"hourFormat",&local_114,status);
      if (0 < local_114) {
        zoneBundle = pUStack_110;
      }
      ures_close_63((UResourceBundle *)resStr);
      ures_close_63(zoneStringsArray);
    }
    if (hourFormats == (UChar *)0x0) {
      hourFormats = L"GMT{0}";
    }
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe98,hourFormats);
    UnicodeString::UnicodeString(&local_160,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffe98,-1);
    initGMTPattern(this,&local_160,status);
    UnicodeString::~UnicodeString(&local_160);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffe98);
    sep._7_1_ = '\x01';
    if ((zoneBundle != (UResourceBundle *)0x0) &&
       (pUStack_178 = u_strchr_63((UChar *)zoneBundle,L';'), pUStack_178 != (UChar *)0x0)) {
      local_17c = U_ZERO_ERROR;
      ConstChar16Ptr::ConstChar16Ptr(&local_188,(char16_t *)zoneBundle);
      UnicodeString::setTo
                ((UnicodeString *)&this->field_0x280,'\0',&local_188,
                 (int32_t)((ulong)((long)pUStack_178 - (long)zoneBundle) >> 1));
      ConstChar16Ptr::~ConstChar16Ptr(&local_188);
      ConstChar16Ptr::ConstChar16Ptr(&local_190,pUStack_178 + 1);
      UnicodeString::setTo((UnicodeString *)&this->field_0x300,'\x01',&local_190,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_190);
      expandOffsetPattern((UnicodeString *)&this->field_0x280,(UnicodeString *)&this->field_0x2c0,
                          &local_17c);
      expandOffsetPattern((UnicodeString *)&this->field_0x300,(UnicodeString *)&this->field_0x340,
                          &local_17c);
      truncateOffsetPattern
                ((UnicodeString *)&this->field_0x280,(UnicodeString *)&this->field_0x380,&local_17c)
      ;
      truncateOffsetPattern
                ((UnicodeString *)&this->field_0x300,(UnicodeString *)&this->field_0x3c0,&local_17c)
      ;
      UVar1 = ::U_SUCCESS(local_17c);
      if (UVar1 != '\0') {
        sep._7_1_ = '\0';
      }
    }
    if (sep._7_1_ != '\0') {
      ConstChar16Ptr::ConstChar16Ptr(&local_198,L"+H");
      UnicodeString::setTo((UnicodeString *)&this->field_0x380,'\x01',&local_198,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_198);
      ConstChar16Ptr::ConstChar16Ptr(&local_1a0,(char16_t *)DEFAULT_GMT_POSITIVE_HM);
      UnicodeString::setTo((UnicodeString *)&this->field_0x280,'\x01',&local_1a0,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_1a0);
      ConstChar16Ptr::ConstChar16Ptr(&local_1a8,(char16_t *)DEFAULT_GMT_POSITIVE_HMS);
      UnicodeString::setTo((UnicodeString *)&this->field_0x2c0,'\x01',&local_1a8,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_1a8);
      ConstChar16Ptr::ConstChar16Ptr(&local_1b0,L"-H");
      UnicodeString::setTo((UnicodeString *)&this->field_0x3c0,'\x01',&local_1b0,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_1b0);
      ConstChar16Ptr::ConstChar16Ptr(&local_1b8,(char16_t *)DEFAULT_GMT_NEGATIVE_HM);
      UnicodeString::setTo((UnicodeString *)&this->field_0x300,'\x01',&local_1b8,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_1b8);
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&ns,(char16_t *)DEFAULT_GMT_NEGATIVE_HMS);
      UnicodeString::setTo((UnicodeString *)&this->field_0x340,'\x01',(ConstChar16Ptr *)&ns,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&ns);
    }
    initGMTOffsetPatterns(this,status);
    this_00 = NumberingSystem::createInstance(locale,status);
    digits.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
    if ((this_00 != (NumberingSystem *)0x0) &&
       (UVar1 = NumberingSystem::isAlgorithmic(this_00), UVar1 == '\0')) {
      (*(this_00->super_UObject)._vptr_UObject[3])(local_210);
      UVar1 = toCodePoints((UnicodeString *)local_210,this->fGMTOffsetDigits,10);
      digits.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = (UVar1 != '\0' ^ 0xffU) & 1;
      UnicodeString::~UnicodeString((UnicodeString *)local_210);
    }
    if (digits.fUnion.fStackFields.fBuffer[0x1a]._1_1_ != '\0') {
      memcpy(this->fGMTOffsetDigits,DEFAULT_GMT_DIGITS,0x28);
    }
    if (this_00 != (NumberingSystem *)0x0) {
      (*(this_00->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

TimeZoneFormat::TimeZoneFormat(const Locale& locale, UErrorCode& status) 
: fLocale(locale), fTimeZoneNames(NULL), fTimeZoneGenericNames(NULL),
  fDefParseOptionFlags(0), fTZDBTimeZoneNames(NULL) {

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatternItems[i] = NULL;
    }

    const char* region = fLocale.getCountry();
    int32_t regionLen = static_cast<int32_t>(uprv_strlen(region));
    if (regionLen == 0) {
        char loc[ULOC_FULLNAME_CAPACITY];
        uloc_addLikelySubtags(fLocale.getName(), loc, sizeof(loc), &status);

        regionLen = uloc_getCountry(loc, fTargetRegion, sizeof(fTargetRegion), &status);
        if (U_SUCCESS(status)) {
            fTargetRegion[regionLen] = 0;
        } else {
            return;
        }
    } else if (regionLen < (int32_t)sizeof(fTargetRegion)) {
        uprv_strcpy(fTargetRegion, region);
    } else {
        fTargetRegion[0] = 0;
    }

    fTimeZoneNames = TimeZoneNames::createInstance(locale, status);
    // fTimeZoneGenericNames is lazily instantiated
    if (U_FAILURE(status)) {
        return;
    }

    const UChar* gmtPattern = NULL;
    const UChar* hourFormats = NULL;

    UResourceBundle *zoneBundle = ures_open(U_ICUDATA_ZONE, locale.getName(), &status);
    UResourceBundle *zoneStringsArray = ures_getByKeyWithFallback(zoneBundle, gZoneStringsTag, NULL, &status);
    if (U_SUCCESS(status)) {
        const UChar* resStr;
        int32_t len;
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gGmtFormatTag, &len, &status);
        if (len > 0) {
            gmtPattern = resStr;
        }
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gGmtZeroFormatTag, &len, &status);
        if (len > 0) {
            fGMTZeroFormat.setTo(TRUE, resStr, len);
        }
        resStr = ures_getStringByKeyWithFallback(zoneStringsArray, gHourFormatTag, &len, &status);
        if (len > 0) {
            hourFormats = resStr;
        }
        ures_close(zoneStringsArray);
        ures_close(zoneBundle);
    }

    if (gmtPattern == NULL) {
        gmtPattern = DEFAULT_GMT_PATTERN;
    }
    initGMTPattern(UnicodeString(TRUE, gmtPattern, -1), status);

    UBool useDefaultOffsetPatterns = TRUE;
    if (hourFormats) {
        UChar *sep = u_strchr(hourFormats, (UChar)0x003B /* ';' */);
        if (sep != NULL) {
            UErrorCode tmpStatus = U_ZERO_ERROR;
            fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM].setTo(FALSE, hourFormats, (int32_t)(sep - hourFormats));
            fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM].setTo(TRUE, sep + 1, -1);
            expandOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HMS], tmpStatus);
            expandOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HMS], tmpStatus);
            truncateOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_H], tmpStatus);
            truncateOffsetPattern(fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM], fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_H], tmpStatus);
            if (U_SUCCESS(tmpStatus)) {
                useDefaultOffsetPatterns = FALSE;
            }
        }
    }
    if (useDefaultOffsetPatterns) {
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_H].setTo(TRUE, DEFAULT_GMT_POSITIVE_H, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HM].setTo(TRUE, DEFAULT_GMT_POSITIVE_HM, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_POSITIVE_HMS].setTo(TRUE, DEFAULT_GMT_POSITIVE_HMS, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_H].setTo(TRUE, DEFAULT_GMT_NEGATIVE_H, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HM].setTo(TRUE, DEFAULT_GMT_NEGATIVE_HM, -1);
        fGMTOffsetPatterns[UTZFMT_PAT_NEGATIVE_HMS].setTo(TRUE, DEFAULT_GMT_NEGATIVE_HMS, -1);
    }
    initGMTOffsetPatterns(status);

    NumberingSystem* ns = NumberingSystem::createInstance(locale, status);
    UBool useDefDigits = TRUE;
    if (ns && !ns->isAlgorithmic()) {
        UnicodeString digits = ns->getDescription();
        useDefDigits = !toCodePoints(digits, fGMTOffsetDigits, 10);
    }
    if (useDefDigits) {
        uprv_memcpy(fGMTOffsetDigits, DEFAULT_GMT_DIGITS, sizeof(UChar32) * 10);
    }
    delete ns;
}